

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O1

int Test_N_VScaleVectorArray(N_Vector X,sunindextype param_2,int myid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  undefined8 *puVar8;
  double dVar9;
  double dVar10;
  timespec spec;
  timespec local_68;
  int local_54;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  puVar4 = (undefined8 *)N_VCloneVectorArray(3,X);
  local_50 = (undefined8 *)N_VCloneVectorArray(3,X);
  N_VConst(0,*puVar4);
  local_48 = 0x4000000000000000;
  iVar7 = 1;
  clock_gettime(1,&local_68);
  lVar5 = local_68.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_68.tv_nsec;
  iVar1 = N_VScaleVectorArray(1,&local_48,puVar4,puVar4);
  sync_device(X);
  clock_gettime(1,&local_68);
  lVar6 = local_68.tv_sec - base_time_tv_sec;
  dVar10 = (double)local_68.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(1.0,(N_Vector)*puVar4,param_2);
    if (iVar1 != 0) goto LAB_0010ae7a;
    iVar7 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleVectorArray Case 1a ");
    }
  }
  else {
LAB_0010ae7a:
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1a, Proc %d \n",(ulong)(uint)myid);
  }
  dVar9 = max_time(X,(dVar10 / 1000000000.0 + (double)lVar6) -
                     (dVar9 / 1000000000.0 + (double)lVar5));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar9,0),"N_VScaleVectorArray");
  }
  N_VConst(0,*puVar4);
  local_48 = 0x4000000000000000;
  clock_gettime(1,&local_68);
  puVar8 = local_50;
  lVar5 = local_68.tv_sec - base_time_tv_sec;
  dVar10 = (double)local_68.tv_nsec;
  iVar1 = N_VScaleVectorArray(1,&local_48,puVar4,local_50);
  sync_device(X);
  clock_gettime(1,&local_68);
  lVar6 = local_68.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_68.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(1.0,(N_Vector)*puVar8,param_2);
    if (iVar1 != 0) goto LAB_0010afab;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleVectorArray Case 1b ");
    }
  }
  else {
LAB_0010afab:
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1b, Proc %d \n",(ulong)(uint)myid);
    iVar7 = iVar7 + 1;
  }
  dVar9 = max_time(X,(dVar9 / 1000000000.0 + (double)lVar6) -
                     (dVar10 / 1000000000.0 + (double)lVar5));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar9,0),"N_VScaleVectorArray");
  }
  N_VConst(0,*puVar4);
  N_VConst(0,puVar4[1]);
  N_VConst(0,puVar4[2]);
  local_48 = 0x4000000000000000;
  uStack_40 = 0x3fe0000000000000;
  local_38 = 0xc000000000000000;
  clock_gettime(1,&local_68);
  lVar5 = local_68.tv_sec - base_time_tv_sec;
  dVar10 = (double)local_68.tv_nsec;
  iVar1 = N_VScaleVectorArray(3,&local_48,puVar4,puVar4);
  sync_device(X);
  clock_gettime(1,&local_68);
  lVar6 = local_68.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_68.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(1.0,(N_Vector)*puVar4,param_2);
    iVar2 = check_ans(-1.0,(N_Vector)puVar4[1],param_2);
    puVar8 = local_50;
    iVar3 = check_ans(2.0,(N_Vector)puVar4[2],param_2);
    if (iVar3 + iVar2 + iVar1 != 0) goto LAB_0010b158;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleVectorArray Case 2a ");
    }
  }
  else {
LAB_0010b158:
    printf(">>> FAILED test -- N_VScaleVectorArray Case 2a, Proc %d \n",(ulong)(uint)myid);
    iVar7 = iVar7 + 1;
  }
  dVar9 = max_time(X,(dVar9 / 1000000000.0 + (double)lVar6) -
                     (dVar10 / 1000000000.0 + (double)lVar5));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar9,0),"N_VScaleVectorArray");
  }
  N_VConst(0,*puVar4);
  N_VConst(0,puVar4[1]);
  N_VConst(0,puVar4[2]);
  local_48 = 0x4000000000000000;
  uStack_40 = 0x3fe0000000000000;
  local_38 = 0xc000000000000000;
  clock_gettime(1,&local_68);
  lVar5 = local_68.tv_sec - base_time_tv_sec;
  dVar9 = (double)local_68.tv_nsec;
  iVar1 = N_VScaleVectorArray(3,&local_48,puVar4,puVar8);
  sync_device(X);
  clock_gettime(1,&local_68);
  lVar6 = local_68.tv_sec - base_time_tv_sec;
  if (iVar1 == 0) {
    local_54 = iVar7;
    iVar1 = check_ans(1.0,(N_Vector)*puVar8,param_2);
    iVar2 = check_ans(-1.0,(N_Vector)puVar8[1],param_2);
    iVar7 = local_54;
    iVar3 = check_ans(2.0,(N_Vector)puVar8[2],param_2);
    if (iVar3 + iVar2 + iVar1 == 0) {
      if (myid == 0) {
        puts("PASSED test -- N_VScaleVectorArray Case 2b ");
      }
      goto LAB_0010b316;
    }
  }
  printf(">>> FAILED test -- N_VScaleVectorArray Case 2b, Proc %d \n",(ulong)(uint)myid);
  iVar7 = iVar7 + 1;
LAB_0010b316:
  dVar9 = max_time(X,((double)local_68.tv_nsec / 1000000000.0 + (double)lVar6) -
                     (dVar9 / 1000000000.0 + (double)lVar5));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar9,0),"N_VScaleVectorArray");
  }
  N_VDestroyVectorArray(puVar4,3);
  N_VDestroyVectorArray(puVar8,3);
  return iVar7;
}

Assistant:

int Test_N_VScaleVectorArray(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;

  sunrealtype c[3];
  N_Vector *Y, *Z;

  /* create vectors for testing */
  Y = N_VCloneVectorArray(3, X);
  Z = N_VCloneVectorArray(3, X);

  /*
   * Case 1a: Y[0] = c[0] Y[0], N_VScale
   */

  /* fill vector data */
  N_VConst(HALF, Y[0]);

  c[0] = TWO;

  start_time = get_time();
  ierr       = N_VScaleVectorArray(1, c, Y, Y);
  sync_device(X);
  stop_time = get_time();

  /* Y[0] should be a vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, Y[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleVectorArray Case 1a \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /*
   * Case 1b: Z[0] = c[0] Y[0], N_VScale
   */

  /* fill vector data */
  N_VConst(HALF, Y[0]);

  c[0] = TWO;

  start_time = get_time();
  ierr       = N_VScaleVectorArray(1, c, Y, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z[0] should be a vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, Z[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleVectorArray Case 1b \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /*
   * Case 2a: Y[i] = c[i] Y[i]
   */

  /* fill vector data */
  N_VConst(HALF, Y[0]);
  N_VConst(NEG_TWO, Y[1]);
  N_VConst(NEG_ONE, Y[2]);

  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_TWO;

  start_time = get_time();
  ierr       = N_VScaleVectorArray(3, c, Y, Y);
  sync_device(X);
  stop_time = get_time();

  /* Y[i] should be a vector of +1, -1, 2 */
  if (ierr == 0)
  {
    failure = check_ans(ONE, Y[0], local_length);
    failure += check_ans(NEG_ONE, Y[1], local_length);
    failure += check_ans(TWO, Y[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 2a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleVectorArray Case 2a \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /*
   * Case 2b: Z[i] = c[i] Y[i]
   */

  /* fill vector data */
  N_VConst(HALF, Y[0]);
  N_VConst(NEG_TWO, Y[1]);
  N_VConst(NEG_ONE, Y[2]);

  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_TWO;

  start_time = get_time();
  ierr       = N_VScaleVectorArray(3, c, Y, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z[i] should be a vector of +1, -1, 2 */
  if (ierr == 0)
  {
    failure = check_ans(ONE, Z[0], local_length);
    failure += check_ans(NEG_ONE, Z[1], local_length);
    failure += check_ans(TWO, Z[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 2b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleVectorArray Case 2b \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(Y, 3);
  N_VDestroyVectorArray(Z, 3);

  return (fails);
}